

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oaa.cc
# Opt level: O1

void learn_randomized(oaa *o,single_learner *base,example *ec)

{
  uint64_t *puVar1;
  float fVar2;
  float fVar3;
  uint uVar4;
  uint32_t uVar5;
  ulong uVar6;
  ostream *poVar7;
  ulong uVar8;
  uint32_t uVar9;
  uint uVar10;
  ulong uVar12;
  float fVar13;
  float fVar14;
  ulong uVar11;
  
  uVar4 = (ec->l).multi.label;
  uVar11 = (ulong)uVar4;
  fVar2 = (ec->l).simple.weight;
  if ((uVar11 == 0) || ((uVar4 != 0xffffffff && (o->k < uVar11)))) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"label ",6);
    poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," is not in {1,",0xe);
    poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"} This won\'t work right.",0x18);
    std::ios::widen((char)poVar7->_vptr_basic_ostream[-3] + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
  }
  (ec->l).multi.label = 0x3f800000;
  *(undefined8 *)((long)&(ec->l).cs.costs._begin + 4) = 0;
  uVar9 = uVar4 - 1;
  puVar1 = &(ec->super_example_predict).ft_offset;
  *puVar1 = *puVar1 + (ulong)(*(int *)(base + 0xe0) * uVar9);
  (**(code **)(base + 0x28))(*(undefined8 *)(base + 0x18),*(undefined8 *)(base + 0x20),ec);
  puVar1 = &(ec->super_example_predict).ft_offset;
  *puVar1 = *puVar1 - (ulong)(*(int *)(base + 0xe0) * uVar9);
  fVar3 = ec->weight;
  fVar14 = ec->partial_prediction;
  (ec->l).multi.label = 0xbf800000;
  ec->weight = ((float)o->k / (float)o->num_subsample) * fVar3;
  uVar8 = o->subsample_id;
  uVar10 = uVar4;
  if (o->num_subsample != 0) {
    uVar12 = 0;
    do {
      uVar5 = o->subsample_order[uVar8];
      uVar8 = (uVar8 + 1) % o->k;
      fVar13 = fVar14;
      if (uVar5 != uVar9) {
        puVar1 = &(ec->super_example_predict).ft_offset;
        *puVar1 = *puVar1 + (ulong)(*(int *)(base + 0xe0) * uVar5);
        (**(code **)(base + 0x28))(*(undefined8 *)(base + 0x18),*(undefined8 *)(base + 0x20),ec);
        puVar1 = &(ec->super_example_predict).ft_offset;
        *puVar1 = *puVar1 - (ulong)(*(int *)(base + 0xe0) * uVar5);
        fVar13 = ec->partial_prediction;
        uVar6 = (ulong)(uVar5 + 1);
        if (fVar13 <= fVar14) {
          fVar13 = fVar14;
          uVar6 = uVar11;
        }
        uVar11 = uVar6;
        uVar12 = uVar12 + 1;
      }
      uVar10 = (uint)uVar11;
      fVar14 = fVar13;
    } while (uVar12 < o->num_subsample);
  }
  o->subsample_id = uVar8;
  (ec->pred).multiclass = uVar10;
  (ec->l).multi.label = uVar4;
  (ec->l).simple.weight = fVar2;
  ec->weight = fVar3;
  return;
}

Assistant:

void learn_randomized(oaa& o, LEARNER::single_learner& base, example& ec)
{
  MULTICLASS::label_t ld = ec.l.multi;
  if (ld.label == 0 || (ld.label > o.k && ld.label != (uint32_t)-1))
    cout << "label " << ld.label << " is not in {1," << o.k << "} This won't work right." << endl;

  ec.l.simple = {1., 0.f, 0.f};  // truth
  base.learn(ec, ld.label - 1);

  size_t prediction = ld.label;
  float best_partial_prediction = ec.partial_prediction;

  ec.l.simple.label = -1.;
  float weight_temp = ec.weight;
  ec.weight *= ((float)o.k) / (float)o.num_subsample;
  size_t p = o.subsample_id;
  size_t count = 0;
  while (count < o.num_subsample)
  {
    uint32_t l = o.subsample_order[p];
    p = (p + 1) % o.k;
    if (l == ld.label - 1)
      continue;
    base.learn(ec, l);
    if (ec.partial_prediction > best_partial_prediction)
    {
      best_partial_prediction = ec.partial_prediction;
      prediction = l + 1;
    }
    count++;
  }
  o.subsample_id = p;

  ec.pred.multiclass = (uint32_t)prediction;
  ec.l.multi = ld;
  ec.weight = weight_temp;
}